

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::SRGBTestCase
          (SRGBTestCase *this,Context *context,char *name,char *description,
          TextureFormat internalFormat)

{
  int i;
  long lVar1;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,description);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SRGBTestCase_00b4a790;
  lVar1 = 0;
  (this->m_framebuffer).
  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)0x0;
  (this->m_textureSourceList).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_textureSourceList).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_textureSourceList).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_samplerList).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_samplerList).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_samplerList).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_renderBufferList).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_renderBufferList).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_renderBufferList).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    (this->m_epsilonError).m_data[lVar1] = 0.005;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  (this->m_textureResultList).
  super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_textureResultList).
  super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_textureResultList).
  super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_resultTextureFormat).order = sRGBA;
  (this->m_resultTextureFormat).type = UNORM_INT8;
  this->m_vaoID = 0;
  this->m_vertexDataID = 0;
  (this->m_shaderParametersList).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_shaderParametersList).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_shaderParametersList).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_shaderProgramList).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_shaderProgramList).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_shaderProgramList).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_samplingGroup = SHADERSAMPLINGGROUP_TEXTURE;
  this->m_internalFormat = internalFormat;
  return;
}

Assistant:

SRGBTestCase::SRGBTestCase	(Context& context, const char* name, const char* description, const tcu::TextureFormat internalFormat)
	: TestCase				(context, name, description)
	, m_epsilonError		(EpsilonError::CPU)
	, m_resultTextureFormat	(tcu::TextureFormat(tcu::TextureFormat::sRGBA, tcu::TextureFormat::UNORM_INT8))
	, m_vaoID				(0)
	, m_vertexDataID		(0)
	, m_samplingGroup		(SHADERSAMPLINGGROUP_TEXTURE)
	, m_internalFormat		(internalFormat)
{
}